

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<std::complex<double>_>::ExtractCoarse
          (TPZDohrAssembly<std::complex<double>_> *this,int isub,
          TPZFMatrix<std::complex<double>_> *global,TPZFMatrix<std::complex<double>_> *local)

{
  int iVar1;
  int iVar2;
  TPZVec<int> *this_00;
  int64_t iVar3;
  int *piVar4;
  complex<double> *pcVar5;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  int64_t in_XMM1_Qa;
  int ic;
  int ncols;
  int ieq;
  int neq;
  TPZVec<int> *avec;
  int iVar6;
  int iVar7;
  
  this_00 = TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 0x28),(long)in_ESI);
  iVar3 = TPZVec<int>::NElements(this_00);
  iVar1 = (int)iVar3;
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  iVar2 = (int)iVar3;
  (**(code **)(*in_RCX + 0x68))(in_RCX,(long)iVar1,(long)iVar2);
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
      piVar4 = TPZVec<int>::operator[](this_00,(long)iVar7);
      (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDX,(long)*piVar4,(long)iVar6);
      iVar3 = in_XMM1_Qa;
      pcVar5 = TPZFMatrix<std::complex<double>_>::operator()
                         ((TPZFMatrix<std::complex<double>_> *)CONCAT44(iVar1,iVar7),
                          CONCAT44(iVar2,iVar6),in_XMM1_Qa);
      *(undefined8 *)pcVar5->_M_value = extraout_XMM0_Qa;
      *(int64_t *)(pcVar5->_M_value + 8) = iVar3;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::ExtractCoarse(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = global.Cols();
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
}